

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserMhapTest_FormatError_Test::~BioparserMhapTest_FormatError_Test
          (BioparserMhapTest_FormatError_Test *this)

{
  BioparserMhapTest_FormatError_Test *this_local;
  
  BioparserMhapTest::~BioparserMhapTest(&this->super_BioparserMhapTest);
  return;
}

Assistant:

TEST_F(BioparserMhapTest, FormatError) {
  Setup("sample.paf");
  try {
    o = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::MhapParser] error: invalid file format");
  }
}